

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexec.c
# Opt level: O2

int onig_regset_replace(OnigRegSet *set,int at,regex_t *reg)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  
  iVar7 = -0x1e;
  if (-1 < at) {
    uVar5 = (ulong)(uint)at;
    uVar4 = set->n;
    if (at < (int)uVar4) {
      if (reg == (regex_t *)0x0) {
        onig_region_free(set->rs[uVar5].region,1);
        uVar4 = set->n - 1;
        lVar6 = uVar5 * 0x10;
        while( true ) {
          if ((int)uVar4 <= (int)uVar5) break;
          puVar1 = (undefined8 *)((long)&set->rs[1].reg + lVar6);
          uVar3 = puVar1[1];
          puVar2 = (undefined8 *)((long)&set->rs->reg + lVar6);
          *puVar2 = *puVar1;
          puVar2[1] = uVar3;
          uVar5 = (ulong)((int)uVar5 + 1);
          lVar6 = lVar6 + 0x10;
        }
        set->n = uVar4;
      }
      else {
        if ((reg->options & 0x10) != 0) {
          return -0x1e;
        }
        if ((1 < uVar4) && (reg->enc != set->enc)) {
          return -0x1e;
        }
        set->rs[uVar5].reg = reg;
      }
      iVar7 = 0;
      lVar8 = 0;
      for (lVar6 = 0; lVar6 < (int)uVar4; lVar6 = lVar6 + 1) {
        update_regset_by_reg(set,*(regex_t **)((long)&set->rs->reg + lVar8));
        uVar4 = set->n;
        lVar8 = lVar8 + 0x10;
      }
    }
  }
  return iVar7;
}

Assistant:

extern int
onig_regset_replace(OnigRegSet* set, int at, regex_t* reg)
{
  int i;

  if (at < 0 || at >= set->n)
    return ONIGERR_INVALID_ARGUMENT;

  if (IS_NULL(reg)) {
    onig_region_free(set->rs[at].region, 1);
    for (i = at; i < set->n - 1; i++) {
      set->rs[i].reg    = set->rs[i+1].reg;
      set->rs[i].region = set->rs[i+1].region;
    }
    set->n--;
  }
  else {
#ifdef USE_FIND_LONGEST_SEARCH_ALL_OF_RANGE
    if (OPTON_FIND_LONGEST(reg->options))
      return ONIGERR_INVALID_ARGUMENT;
#endif

    if (set->n > 1 && reg->enc != set->enc)
      return ONIGERR_INVALID_ARGUMENT;

    set->rs[at].reg = reg;
  }

  for (i = 0; i < set->n; i++)
    update_regset_by_reg(set, set->rs[i].reg);

  return 0;
}